

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O0

int ProcessRequest(httprequest *req)

{
  uint __errnum;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  uint *puVar5;
  char *pcVar6;
  void *pvVar7;
  int *piVar8;
  ulong uVar9;
  bool bVar10;
  undefined4 uVar11;
  unsigned_long clen;
  char *ptr_1;
  char *endptr;
  char *portp;
  int i;
  int error_1;
  char *rtp_scratch;
  int rtp_partno;
  int rtp_size;
  int rtp_channel;
  int num;
  size_t cmdsize;
  char *cmd;
  char *pcStack_158;
  int error;
  char *filename;
  FILE *stream;
  char logbuf [256];
  byte *local_40;
  char *ptr;
  char *end;
  uint local_28;
  int prot_minor;
  int prot_major;
  _Bool chunked;
  char *line;
  httprequest *req_local;
  
  _prot_major = req->reqbuf + req->checkindex;
  prot_minor._3_1_ = 0;
  line = req->reqbuf;
  ptr = strstr(_prot_major,"\r\n\r\n");
  logmsg("ProcessRequest() called with testno %ld and line [%s]",*(undefined8 *)(line + 0x24a00),
         _prot_major);
  if (*(long *)(line + 0x24a00) == -7) {
    lVar4 = (long)&end + 4;
    iVar1 = __isoc99_sscanf(_prot_major,"%255s %139999s %4s/%d.%d",ProcessRequest::request,
                            ProcessRequest::doc,ProcessRequest::prot_str,&local_28,lVar4);
    uVar11 = (undefined4)((ulong)lVar4 >> 0x20);
    if (iVar1 == 5) {
      iVar1 = strcmp(ProcessRequest::prot_str,"HTTP");
      if (iVar1 == 0) {
        line[0x24a30] = '\x02';
        line[0x24a31] = '\0';
        line[0x24a32] = '\0';
        line[0x24a33] = '\0';
      }
      else {
        iVar1 = strcmp(ProcessRequest::prot_str,"RTSP");
        if (iVar1 != 0) {
          line[0x24a30] = '\0';
          line[0x24a31] = '\0';
          line[0x24a32] = '\0';
          line[0x24a33] = '\0';
          logmsg("got unknown protocol %s",ProcessRequest::prot_str);
          return 1;
        }
        line[0x24a30] = '\x01';
        line[0x24a31] = '\0';
        line[0x24a32] = '\0';
        line[0x24a33] = '\0';
      }
      *(uint *)(line + 0x24a34) = local_28 * 10 + end._4_4_;
      local_40 = (byte *)strrchr(ProcessRequest::doc,0x2f);
      if (local_40 == (byte *)0x0) {
        iVar1 = __isoc99_sscanf(line,"CONNECT %139999s HTTP/%d.%d",ProcessRequest::doc,&local_28,
                                (long)&end + 4);
        if (iVar1 == 3) {
          curl_msnprintf((char *)&stream,0x100,"Received a CONNECT %s HTTP/%d.%d request",
                         ProcessRequest::doc,(ulong)local_28,(ulong)end._4_4_);
          logmsg("%s",&stream);
          if (*(int *)(line + 0x24a34) == 10) {
            line[0x24a10] = '\0';
          }
          iVar1 = strncmp(ProcessRequest::doc,"bad",3);
          if (iVar1 == 0) {
            line[0x24a00] = -5;
            line[0x24a01] = -1;
            line[0x24a02] = -1;
            line[0x24a03] = -1;
            line[0x24a04] = -1;
            line[0x24a05] = -1;
            line[0x24a06] = -1;
            line[0x24a07] = -1;
          }
          else {
            iVar1 = strncmp(ProcessRequest::doc,"test",4);
            if (iVar1 == 0) {
              endptr = strchr(ProcessRequest::doc,0x3a);
              if (((endptr == (char *)0x0) || (endptr[1] == '\0')) ||
                 (iVar1 = Curl_isdigit((uint)(byte)endptr[1]), iVar1 == 0)) {
                line[0x24a00] = -3;
                line[0x24a01] = -1;
                line[0x24a02] = -1;
                line[0x24a03] = -1;
                line[0x24a04] = -1;
                line[0x24a05] = -1;
                line[0x24a06] = -1;
                line[0x24a07] = -1;
              }
              else {
                lVar4 = strtol(endptr + 1,(char **)0x0,10);
                *(long *)(line + 0x24a00) = lVar4;
              }
            }
            else {
              line[0x24a00] = -3;
              line[0x24a01] = -1;
              line[0x24a02] = -1;
              line[0x24a03] = -1;
              line[0x24a04] = -1;
              line[0x24a05] = -1;
              line[0x24a06] = -1;
              line[0x24a07] = -1;
            }
          }
        }
        else {
          logmsg("Did not find test number in PATH");
          line[0x24a00] = -1;
          line[0x24a01] = -1;
          line[0x24a02] = -1;
          line[0x24a03] = -1;
          line[0x24a04] = -1;
          line[0x24a05] = -1;
          line[0x24a06] = -1;
          line[0x24a07] = -1;
        }
      }
      else {
        sVar2 = strlen(ProcessRequest::doc);
        sVar3 = strlen(ProcessRequest::request);
        if (sVar2 + sVar3 < 200) {
          curl_msnprintf((char *)&stream,0x100,"Got request: %s %s %s/%d.%d",ProcessRequest::request
                         ,ProcessRequest::doc,ProcessRequest::prot_str,CONCAT44(uVar11,local_28),
                         end._4_4_);
        }
        else {
          curl_msnprintf((char *)&stream,0x100,"Got a *HUGE* request %s/%d.%d",
                         ProcessRequest::prot_str,(ulong)local_28,(ulong)end._4_4_);
        }
        logmsg("%s",&stream);
        iVar1 = strncmp("/verifiedserver",(char *)local_40,0xf);
        if (iVar1 == 0) {
          logmsg("Are-we-friendly question received");
          line[0x24a00] = -2;
          line[0x24a01] = -1;
          line[0x24a02] = -1;
          line[0x24a03] = -1;
          line[0x24a04] = -1;
          line[0x24a05] = -1;
          line[0x24a06] = -1;
          line[0x24a07] = -1;
          return 1;
        }
        iVar1 = strncmp("/quit",(char *)local_40,5);
        if (iVar1 == 0) {
          logmsg("Request-to-quit received");
          line[0x24a00] = -6;
          line[0x24a01] = -1;
          line[0x24a02] = -1;
          line[0x24a03] = -1;
          line[0x24a04] = -1;
          line[0x24a05] = -1;
          line[0x24a06] = -1;
          line[0x24a07] = -1;
          return 1;
        }
        do {
          local_40 = local_40 + 1;
          bVar10 = false;
          if (*local_40 != 0) {
            iVar1 = Curl_isdigit((uint)*local_40);
            bVar10 = iVar1 == 0;
          }
        } while (bVar10);
        lVar4 = strtol((char *)local_40,(char **)&local_40,10);
        *(long *)(line + 0x24a00) = lVar4;
        if (*(long *)(line + 0x24a00) < 0x2711) {
          line[0x24a08] = '\0';
          line[0x24a09] = '\0';
          line[0x24a0a] = '\0';
          line[0x24a0b] = '\0';
          line[0x24a0c] = '\0';
          line[0x24a0d] = '\0';
          line[0x24a0e] = '\0';
          line[0x24a0f] = '\0';
        }
        else {
          *(long *)(line + 0x24a08) = *(long *)(line + 0x24a00) % 10000;
          *(long *)(line + 0x24a00) = *(long *)(line + 0x24a00) / 10000;
        }
        curl_msnprintf((char *)&stream,0x100,"Requested test number %ld part %ld",
                       *(undefined8 *)(line + 0x24a00),*(undefined8 *)(line + 0x24a08));
        logmsg("%s",&stream);
        pcStack_158 = test2file(*(long *)(line + 0x24a00));
        filename = (char *)fopen64(pcStack_158,"rb");
        if ((FILE *)filename == (FILE *)0x0) {
          puVar5 = (uint *)__errno_location();
          __errnum = *puVar5;
          cmd._4_4_ = __errnum;
          pcVar6 = strerror(__errnum);
          logmsg("fopen() failed with error: %d %s",(ulong)__errnum,pcVar6);
          logmsg("Error opening file: %s",pcStack_158);
          logmsg("Couldn\'t open test file %ld",*(undefined8 *)(line + 0x24a00));
          line[0x24a10] = '\0';
          return 1;
        }
        cmdsize = 0;
        _rtp_channel = 0;
        rtp_size = 0;
        rtp_partno = 0;
        rtp_scratch._4_4_ = 0;
        rtp_scratch._0_4_ = 0xffffffff;
        _i = (undefined1 *)0x0;
        portp._4_4_ = getpart((char **)&cmdsize,(size_t *)&rtp_channel,"reply","servercmd",
                              (FILE *)filename);
        fclose((FILE *)filename);
        if (portp._4_4_ != 0) {
          logmsg("getpart() failed with error: %d",(ulong)portp._4_4_);
          line[0x24a10] = '\0';
          return 1;
        }
        local_40 = (byte *)cmdsize;
        if (_rtp_channel != 0) {
          logmsg("Found a reply-servercmd section!");
          do {
            iVar1 = strncmp("auth_required",(char *)local_40,0xd);
            if (iVar1 == 0) {
              logmsg("instructed to require authorization header");
              line[0x24a11] = '\x01';
            }
            else {
              iVar1 = strncmp("idle",(char *)local_40,4);
              if (iVar1 == 0) {
                logmsg("instructed to idle");
                line[0x24a2c] = '\x01';
                line[0x24a2d] = '\0';
                line[0x24a2e] = '\0';
                line[0x24a2f] = '\0';
                line[0x24a10] = '\x01';
              }
              else {
                iVar1 = strncmp("stream",(char *)local_40,6);
                if (iVar1 == 0) {
                  logmsg("instructed to stream");
                  line[0x24a2c] = '\x02';
                  line[0x24a2d] = '\0';
                  line[0x24a2e] = '\0';
                  line[0x24a2f] = '\0';
                }
                else {
                  iVar1 = __isoc99_sscanf(local_40,"pipe: %d",&rtp_size);
                  if (iVar1 == 1) {
                    logmsg("instructed to allow a pipe size of %d",(ulong)(uint)rtp_size);
                    if (rtp_size < 0) {
                      logmsg("negative pipe size ignored");
                    }
                    else if (0 < rtp_size) {
                      *(int *)(line + 0x24a24) = rtp_size + -1;
                    }
                  }
                  else {
                    iVar1 = __isoc99_sscanf(local_40,"skip: %d",&rtp_size);
                    if (iVar1 == 1) {
                      logmsg("instructed to skip this number of bytes %d",(ulong)(uint)rtp_size);
                      *(int *)(line + 0x24a28) = rtp_size;
                    }
                    else {
                      iVar1 = __isoc99_sscanf(local_40,"rtp: part %d channel %d size %d",
                                              &rtp_scratch,&rtp_partno,(long)&rtp_scratch + 4);
                      if (iVar1 == 3) {
                        if ((long)(int)(uint)rtp_scratch == *(long *)(line + 0x24a08)) {
                          portp._0_4_ = 0;
                          logmsg("RTP: part %d channel %d size %d",(ulong)(uint)rtp_scratch,
                                 (ulong)(uint)rtp_partno,(ulong)rtp_scratch._4_4_);
                          _i = (undefined1 *)malloc((long)(int)(rtp_scratch._4_4_ + 0x10));
                          *_i = 0x24;
                          _i[1] = (char)rtp_partno;
                          _i[2] = (char)(rtp_scratch._4_4_ >> 8);
                          _i[3] = (char)rtp_scratch._4_4_;
                          for (portp._0_4_ = 0; pcVar6 = RTP_DATA,
                              (int)portp < (int)rtp_scratch._4_4_; portp._0_4_ = (int)portp + 0xc) {
                            *(undefined8 *)(_i + (long)(int)portp + 4) = *(undefined8 *)RTP_DATA;
                            *(undefined4 *)(_i + (long)(int)portp + 0xc) =
                                 *(undefined4 *)(pcVar6 + 8);
                          }
                          if (*(long *)(line + 0x24a40) == 0) {
                            *(undefined1 **)(line + 0x24a40) = _i;
                            *(long *)(line + 0x24a48) = (long)(int)(rtp_scratch._4_4_ + 4);
                          }
                          else {
                            pvVar7 = realloc(*(void **)(line + 0x24a40),
                                             *(long *)(line + 0x24a48) +
                                             (long)(int)rtp_scratch._4_4_ + 4);
                            *(void **)(line + 0x24a40) = pvVar7;
                            memcpy((void *)(*(long *)(line + 0x24a40) + *(long *)(line + 0x24a48)),
                                   _i,(long)(int)(rtp_scratch._4_4_ + 4));
                            *(long *)(line + 0x24a48) =
                                 (long)(int)(rtp_scratch._4_4_ + 4) + *(long *)(line + 0x24a48);
                            free(_i);
                          }
                          logmsg("rtp_buffersize is %zu, rtp_size is %d.",
                                 *(undefined8 *)(line + 0x24a48),(ulong)rtp_scratch._4_4_);
                        }
                      }
                      else {
                        logmsg("funny instruction found: %s",local_40);
                      }
                    }
                  }
                }
              }
            }
            pcVar6 = strchr((char *)local_40,10);
            if (pcVar6 == (char *)0x0) {
              local_40 = (byte *)0x0;
            }
            else {
              local_40 = (byte *)(pcVar6 + 1);
            }
            bVar10 = false;
            if (local_40 != (byte *)0x0) {
              bVar10 = *local_40 != 0;
            }
          } while (bVar10);
          logmsg("Done parsing server commands");
        }
        free((void *)cmdsize);
      }
    }
  }
  if (ptr == (char *)0x0) {
    logmsg("ProcessRequest returned without a complete request");
    return 0;
  }
  logmsg("ProcessRequest found a complete request");
  if (*(int *)(line + 0x24a24) != 0) {
    *(char **)(line + 150000) = ptr + *(long *)(line + 150000) + (4 - (long)_prot_major);
  }
  while( true ) {
    if (got_exit_signal != 0) {
      return 1;
    }
    if ((*(long *)(line + 0x24a18) == 0) &&
       (iVar1 = Curl_strncasecompare("Content-Length:",_prot_major,0xf), iVar1 != 0)) break;
    iVar1 = Curl_strncasecompare("Transfer-Encoding: chunked",_prot_major,0x1a);
    if (iVar1 != 0) {
      prot_minor._3_1_ = 1;
    }
    if ((prot_minor._3_1_ & 1) != 0) {
      pcVar6 = strstr(line,"\r\n0\r\n\r\n");
      if (pcVar6 == (char *)0x0) {
        return 0;
      }
      return 1;
    }
    _prot_major = strchr(_prot_major,10);
    if (_prot_major != (char *)0x0) {
      _prot_major = _prot_major + 1;
    }
    if (_prot_major == (char *)0x0) goto LAB_00109bd0;
  }
  clen = (unsigned_long)(_prot_major + 0xf);
  while( true ) {
    bVar10 = false;
    if (*(char *)clen != '\0') {
      iVar1 = Curl_isspace((uint)*(byte *)clen);
      bVar10 = iVar1 != 0;
    }
    if (!bVar10) break;
    clen = clen + 1;
  }
  ptr_1 = (char *)clen;
  piVar8 = __errno_location();
  *piVar8 = 0;
  uVar9 = strtoul((char *)clen,&ptr_1,10);
  if ((((char *)clen == ptr_1) || (iVar1 = Curl_isspace((uint)(byte)*ptr_1), iVar1 == 0)) ||
     (piVar8 = __errno_location(), *piVar8 == 0x22)) {
    logmsg("Found invalid Content-Length: (%s) in the request",clen);
    line[0x24a10] = '\0';
    return 1;
  }
  *(ulong *)(line + 0x24a18) = uVar9 - (long)*(int *)(line + 0x24a28);
  logmsg("Found Content-Length: %lu in the request",uVar9);
  if (*(int *)(line + 0x24a28) != 0) {
    logmsg("... but will abort after %zu bytes",*(undefined8 *)(line + 0x24a18));
  }
LAB_00109bd0:
  if ((((line[0x24a12] & 1U) == 0) &&
      (pcVar6 = strstr(line,"Authorization:"), pcVar6 != (char *)0x0)) &&
     (line[0x24a12] = '\x01', (line[0x24a11] & 1U) != 0)) {
    logmsg("Authorization header found, as required");
  }
  if (((line[0x24a20] & 1U) == 0) &&
     (pcVar6 = strstr(line,"Authorization: Digest"), pcVar6 != (char *)0x0)) {
    *(long *)(line + 0x24a08) = *(long *)(line + 0x24a08) + 1000;
    line[0x24a20] = '\x01';
    logmsg("Received Digest request, sending back data %ld",*(undefined8 *)(line + 0x24a08));
  }
  else if (((line[0x24a21] & 1U) == 0) &&
          (pcVar6 = strstr(line,"Authorization: NTLM TlRMTVNTUAAD"), pcVar6 != (char *)0x0)) {
    *(long *)(line + 0x24a08) = *(long *)(line + 0x24a08) + 0x3ea;
    line[0x24a21] = '\x01';
    logmsg("Received NTLM type-3, sending back data %ld",*(undefined8 *)(line + 0x24a08));
    if (*(long *)(line + 0x24a18) != 0) {
      logmsg("  Expecting %zu POSTed bytes",*(undefined8 *)(line + 0x24a18));
    }
  }
  else if (((line[0x24a21] & 1U) == 0) &&
          (pcVar6 = strstr(line,"Authorization: NTLM TlRMTVNTUAAB"), pcVar6 != (char *)0x0)) {
    *(long *)(line + 0x24a08) = *(long *)(line + 0x24a08) + 0x3e9;
    line[0x24a21] = '\x01';
    logmsg("Received NTLM type-1, sending back data %ld",*(undefined8 *)(line + 0x24a08));
  }
  else if ((999 < *(long *)(line + 0x24a08)) &&
          (pcVar6 = strstr(line,"Authorization: Basic"), pcVar6 != (char *)0x0)) {
    *(long *)(line + 0x24a08) = *(long *)(line + 0x24a08) + 1;
    logmsg("Received Basic request, sending back data %ld",*(undefined8 *)(line + 0x24a08));
  }
  pcVar6 = strstr(line,"Connection: close");
  if (pcVar6 != (char *)0x0) {
    line[0x24a10] = '\0';
  }
  if (((((*(int *)(line + 0x24a24) == 0) && ((line[0x24a10] & 1U) != 0)) &&
       (10 < *(int *)(line + 0x24a34))) &&
      ((ptr != (char *)0x0 && (ptr + 4 < line + *(long *)(line + 0x249f8))))) &&
     ((iVar1 = strncmp(line,"GET",3), iVar1 == 0 || (iVar1 = strncmp(line,"HEAD",4), iVar1 == 0))))
  {
    *(char **)(line + 150000) = ptr + (4 - (long)line);
    line[0x24a38] = '\x01';
  }
  while (*(int *)(line + 0x24a24) != 0) {
    if (got_exit_signal != 0) {
      return 1;
    }
    _prot_major = line + *(long *)(line + 150000);
    ptr = strstr(_prot_major,"\r\n\r\n");
    if (ptr == (char *)0x0) break;
    *(char **)(line + 150000) = ptr + *(long *)(line + 150000) + (4 - (long)_prot_major);
    *(int *)(line + 0x24a24) = *(int *)(line + 0x24a24) + -1;
  }
  if (((line[0x24a11] & 1U) != 0) && ((line[0x24a12] & 1U) == 0)) {
    return 1;
  }
  if (*(long *)(line + 0x24a18) == 0) {
    return 1;
  }
  if ((*(long *)(line + 0x249f8) - ((long)ptr - (long)line)) - 4U < *(ulong *)(line + 0x24a18)) {
    return 0;
  }
  return 1;
}

Assistant:

static int ProcessRequest(struct httprequest *req)
{
  char *line = &req->reqbuf[req->checkindex];
  bool chunked = FALSE;
  static char request[REQUEST_KEYWORD_SIZE];
  static char doc[MAXDOCNAMELEN];
  static char prot_str[5];
  int prot_major, prot_minor;
  char *end = strstr(line, END_OF_HEADERS);

  logmsg("ProcessRequest() called with testno %ld and line [%s]",
         req->testno, line);

  /* try to figure out the request characteristics as soon as possible, but
     only once! */
  if((req->testno == DOCNUMBER_NOTHING) &&
     sscanf(line,
            "%" REQUEST_KEYWORD_SIZE_TXT"s %" MAXDOCNAMELEN_TXT "s %4s/%d.%d",
            request,
            doc,
            prot_str,
            &prot_major,
            &prot_minor) == 5) {
    char *ptr;
    char logbuf[256];

    if(!strcmp(prot_str, "HTTP")) {
      req->protocol = RPROT_HTTP;
    }
    else if(!strcmp(prot_str, "RTSP")) {
      req->protocol = RPROT_RTSP;
    }
    else {
      req->protocol = RPROT_NONE;
      logmsg("got unknown protocol %s", prot_str);
      return 1;
    }

    req->prot_version = prot_major*10 + prot_minor;

    /* find the last slash */
    ptr = strrchr(doc, '/');

    /* get the number after it */
    if(ptr) {
      FILE *stream;
      char *filename;

      if((strlen(doc) + strlen(request)) < 200)
        snprintf(logbuf, sizeof(logbuf), "Got request: %s %s %s/%d.%d",
                 request, doc, prot_str, prot_major, prot_minor);
      else
        snprintf(logbuf, sizeof(logbuf), "Got a *HUGE* request %s/%d.%d",
                prot_str, prot_major, prot_minor);
      logmsg("%s", logbuf);

      if(!strncmp("/verifiedserver", ptr, 15)) {
        logmsg("Are-we-friendly question received");
        req->testno = DOCNUMBER_WERULEZ;
        return 1; /* done */
      }

      if(!strncmp("/quit", ptr, 5)) {
        logmsg("Request-to-quit received");
        req->testno = DOCNUMBER_QUIT;
        return 1; /* done */
      }

      ptr++; /* skip the slash */

      /* skip all non-numericals following the slash */
      while(*ptr && !ISDIGIT(*ptr))
        ptr++;

      req->testno = strtol(ptr, &ptr, 10);

      if(req->testno > 10000) {
        req->partno = req->testno % 10000;
        req->testno /= 10000;
      }
      else
        req->partno = 0;

      snprintf(logbuf, sizeof(logbuf), "Requested test number %ld part %ld",
               req->testno, req->partno);
      logmsg("%s", logbuf);

      filename = test2file(req->testno);

      stream = fopen(filename, "rb");
      if(!stream) {
        int error = errno;
        logmsg("fopen() failed with error: %d %s", error, strerror(error));
        logmsg("Error opening file: %s", filename);
        logmsg("Couldn't open test file %ld", req->testno);
        req->open = FALSE; /* closes connection */
        return 1; /* done */
      }
      else {
        char *cmd = NULL;
        size_t cmdsize = 0;
        int num = 0;

        int rtp_channel = 0;
        int rtp_size = 0;
        int rtp_partno = -1;
        char *rtp_scratch = NULL;

        /* get the custom server control "commands" */
        int error = getpart(&cmd, &cmdsize, "reply", "servercmd", stream);
        fclose(stream);
        if(error) {
          logmsg("getpart() failed with error: %d", error);
          req->open = FALSE; /* closes connection */
          return 1; /* done */
        }
        ptr = cmd;

        if(cmdsize) {
          logmsg("Found a reply-servercmd section!");
          do {
            if(!strncmp(CMD_AUTH_REQUIRED, ptr, strlen(CMD_AUTH_REQUIRED))) {
              logmsg("instructed to require authorization header");
              req->auth_req = TRUE;
            }
            else if(!strncmp(CMD_IDLE, ptr, strlen(CMD_IDLE))) {
              logmsg("instructed to idle");
              req->rcmd = RCMD_IDLE;
              req->open = TRUE;
            }
            else if(!strncmp(CMD_STREAM, ptr, strlen(CMD_STREAM))) {
              logmsg("instructed to stream");
              req->rcmd = RCMD_STREAM;
            }
            else if(1 == sscanf(ptr, "pipe: %d", &num)) {
              logmsg("instructed to allow a pipe size of %d", num);
              if(num < 0)
                logmsg("negative pipe size ignored");
              else if(num > 0)
                req->pipe = num-1; /* decrease by one since we don't count the
                                      first request in this number */
            }
            else if(1 == sscanf(ptr, "skip: %d", &num)) {
              logmsg("instructed to skip this number of bytes %d", num);
              req->skip = num;
            }
            else if(3 == sscanf(ptr, "rtp: part %d channel %d size %d",
                                &rtp_partno, &rtp_channel, &rtp_size)) {

              if(rtp_partno == req->partno) {
                int i = 0;
                logmsg("RTP: part %d channel %d size %d",
                       rtp_partno, rtp_channel, rtp_size);

                /* Make our scratch buffer enough to fit all the
                 * desired data and one for padding */
                rtp_scratch = malloc(rtp_size + 4 + RTP_DATA_SIZE);

                /* RTP is signalled with a $ */
                rtp_scratch[0] = '$';

                /* The channel follows and is one byte */
                SET_RTP_PKT_CHN(rtp_scratch, rtp_channel);

                /* Length follows and is a two byte short in network order */
                SET_RTP_PKT_LEN(rtp_scratch, rtp_size);

                /* Fill it with junk data */
                for(i = 0; i < rtp_size; i += RTP_DATA_SIZE) {
                  memcpy(rtp_scratch + 4 + i, RTP_DATA, RTP_DATA_SIZE);
                }

                if(req->rtp_buffer == NULL) {
                  req->rtp_buffer = rtp_scratch;
                  req->rtp_buffersize = rtp_size + 4;
                }
                else {
                  req->rtp_buffer = realloc(req->rtp_buffer,
                                            req->rtp_buffersize +
                                            rtp_size + 4);
                  memcpy(req->rtp_buffer + req->rtp_buffersize, rtp_scratch,
                         rtp_size + 4);
                  req->rtp_buffersize += rtp_size + 4;
                  free(rtp_scratch);
                }
                logmsg("rtp_buffersize is %zu, rtp_size is %d.",
                       req->rtp_buffersize, rtp_size);
              }
            }
            else {
              logmsg("funny instruction found: %s", ptr);
            }

            ptr = strchr(ptr, '\n');
            if(ptr)
              ptr++;
            else
              ptr = NULL;
          } while(ptr && *ptr);
          logmsg("Done parsing server commands");
        }
        free(cmd);
      }
    }
    else {
      if(sscanf(req->reqbuf, "CONNECT %" MAXDOCNAMELEN_TXT "s HTTP/%d.%d",
                doc, &prot_major, &prot_minor) == 3) {
        snprintf(logbuf, sizeof(logbuf),
                 "Received a CONNECT %s HTTP/%d.%d request",
                 doc, prot_major, prot_minor);
        logmsg("%s", logbuf);

        if(req->prot_version == 10)
          req->open = FALSE; /* HTTP 1.0 closes connection by default */

        if(!strncmp(doc, "bad", 3))
          /* if the host name starts with bad, we fake an error here */
          req->testno = DOCNUMBER_BADCONNECT;
        else if(!strncmp(doc, "test", 4)) {
          /* if the host name starts with test, the port number used in the
             CONNECT line will be used as test number! */
          char *portp = strchr(doc, ':');
          if(portp && (*(portp + 1) != '\0') && ISDIGIT(*(portp + 1)))
            req->testno = strtol(portp + 1, NULL, 10);
          else
            req->testno = DOCNUMBER_CONNECT;
        }
        else
          req->testno = DOCNUMBER_CONNECT;
      }
      else {
        logmsg("Did not find test number in PATH");
        req->testno = DOCNUMBER_404;
      }
    }
  }

  if(!end) {
    /* we don't have a complete request yet! */
    logmsg("ProcessRequest returned without a complete request");
    return 0; /* not complete yet */
  }
  logmsg("ProcessRequest found a complete request");

  if(req->pipe)
    /* we do have a full set, advance the checkindex to after the end of the
       headers, for the pipelining case mostly */
    req->checkindex += (end - line) + strlen(END_OF_HEADERS);

  /* **** Persistence ****
   *
   * If the request is a HTTP/1.0 one, we close the connection unconditionally
   * when we're done.
   *
   * If the request is a HTTP/1.1 one, we MUST check for a "Connection:"
   * header that might say "close". If it does, we close a connection when
   * this request is processed. Otherwise, we keep the connection alive for X
   * seconds.
   */

  do {
    if(got_exit_signal)
      return 1; /* done */

    if((req->cl == 0) && strncasecompare("Content-Length:", line, 15)) {
      /* If we don't ignore content-length, we read it and we read the whole
         request including the body before we return. If we've been told to
         ignore the content-length, we will return as soon as all headers
         have been received */
      char *endptr;
      char *ptr = line + 15;
      unsigned long clen = 0;
      while(*ptr && ISSPACE(*ptr))
        ptr++;
      endptr = ptr;
      errno = 0;
      clen = strtoul(ptr, &endptr, 10);
      if((ptr == endptr) || !ISSPACE(*endptr) || (ERANGE == errno)) {
        /* this assumes that a zero Content-Length is valid */
        logmsg("Found invalid Content-Length: (%s) in the request", ptr);
        req->open = FALSE; /* closes connection */
        return 1; /* done */
      }
      req->cl = clen - req->skip;

      logmsg("Found Content-Length: %lu in the request", clen);
      if(req->skip)
        logmsg("... but will abort after %zu bytes", req->cl);
      break;
    }
    else if(strncasecompare("Transfer-Encoding: chunked", line,
                            strlen("Transfer-Encoding: chunked"))) {
      /* chunked data coming in */
      chunked = TRUE;
    }

    if(chunked) {
      if(strstr(req->reqbuf, "\r\n0\r\n\r\n"))
        /* end of chunks reached */
        return 1; /* done */
      else
        return 0; /* not done */
    }

    line = strchr(line, '\n');
    if(line)
      line++;

  } while(line);

  if(!req->auth && strstr(req->reqbuf, "Authorization:")) {
    req->auth = TRUE; /* Authorization: header present! */
    if(req->auth_req)
      logmsg("Authorization header found, as required");
  }

  if(!req->digest && strstr(req->reqbuf, "Authorization: Digest")) {
    /* If the client is passing this Digest-header, we set the part number
       to 1000. Not only to spice up the complexity of this, but to make
       Digest stuff to work in the test suite. */
    req->partno += 1000;
    req->digest = TRUE; /* header found */
    logmsg("Received Digest request, sending back data %ld", req->partno);
  }
  else if(!req->ntlm &&
          strstr(req->reqbuf, "Authorization: NTLM TlRMTVNTUAAD")) {
    /* If the client is passing this type-3 NTLM header */
    req->partno += 1002;
    req->ntlm = TRUE; /* NTLM found */
    logmsg("Received NTLM type-3, sending back data %ld", req->partno);
    if(req->cl) {
      logmsg("  Expecting %zu POSTed bytes", req->cl);
    }
  }
  else if(!req->ntlm &&
          strstr(req->reqbuf, "Authorization: NTLM TlRMTVNTUAAB")) {
    /* If the client is passing this type-1 NTLM header */
    req->partno += 1001;
    req->ntlm = TRUE; /* NTLM found */
    logmsg("Received NTLM type-1, sending back data %ld", req->partno);
  }
  else if((req->partno >= 1000) &&
          strstr(req->reqbuf, "Authorization: Basic")) {
    /* If the client is passing this Basic-header and the part number is
       already >=1000, we add 1 to the part number.  This allows simple Basic
       authentication negotiation to work in the test suite. */
    req->partno += 1;
    logmsg("Received Basic request, sending back data %ld", req->partno);
  }
  if(strstr(req->reqbuf, "Connection: close"))
    req->open = FALSE; /* close connection after this request */

  if(!req->pipe &&
     req->open &&
     req->prot_version >= 11 &&
     end &&
     req->reqbuf + req->offset > end + strlen(END_OF_HEADERS) &&
     (!strncmp(req->reqbuf, "GET", strlen("GET")) ||
      !strncmp(req->reqbuf, "HEAD", strlen("HEAD")))) {
    /* If we have a persistent connection, HTTP version >= 1.1
       and GET/HEAD request, enable pipelining. */
    req->checkindex = (end - req->reqbuf) + strlen(END_OF_HEADERS);
    req->pipelining = TRUE;
  }

  while(req->pipe) {
    if(got_exit_signal)
      return 1; /* done */
    /* scan for more header ends within this chunk */
    line = &req->reqbuf[req->checkindex];
    end = strstr(line, END_OF_HEADERS);
    if(!end)
      break;
    req->checkindex += (end - line) + strlen(END_OF_HEADERS);
    req->pipe--;
  }

  /* If authentication is required and no auth was provided, end now. This
     makes the server NOT wait for PUT/POST data and you can then make the
     test case send a rejection before any such data has been sent. Test case
     154 uses this.*/
  if(req->auth_req && !req->auth)
    return 1; /* done */

  if(req->cl > 0) {
    if(req->cl <= req->offset - (end - req->reqbuf) - strlen(END_OF_HEADERS))
      return 1; /* done */
    else
      return 0; /* not complete yet */
  }

  return 1; /* done */
}